

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

void __thiscall
gl4cts::FunctionObject::unary<double,_tcu::Vector<double,_3>_>::call
          (unary<double,_tcu::Vector<double,_3>_> *this,GLvoid *result_dst,GLvoid *argument_src)

{
  functionPointer p_function;
  Vector<double,_3> arg;
  double result;
  GLvoid *argument_src_local;
  GLvoid *result_dst_local;
  unary<double,_tcu::Vector<double,_3>_> *this_local;
  
  tcu::Vector<double,_3>::Vector((Vector<double,_3> *)&p_function);
  unpack<tcu::Vector<double,_3>_>::get(argument_src,(Vector<double,_3> *)&p_function);
  arg.m_data[2] =
       (double)(*(code *)(this->super_unaryBase).super_functionObject.m_p_function)(&p_function);
  pack<double>::set(result_dst,arg.m_data + 2);
  return;
}

Assistant:

virtual void call(glw::GLvoid* result_dst, const glw::GLvoid* argument_src) const
	{
		ResT result;
		ArgT arg;

		unpack<ArgT>::get(argument_src, arg);

		functionPointer p_function = (functionPointer)m_p_function;

		result = p_function(arg);

		pack<ResT>::set(result_dst, result);
	}